

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O3

Request<capnp::AnyPointer,_capnp::AnyPointer> * __thiscall
capnp::_::anon_unknown_0::RpcConnectionState::PromiseClient::newCall
          (Request<capnp::AnyPointer,_capnp::AnyPointer> *__return_storage_ptr__,PromiseClient *this
          ,uint64_t interfaceId,uint16_t methodId,Maybe<capnp::MessageSize> *sizeHint)

{
  ClientHook *pCVar1;
  long *plVar2;
  undefined8 *local_68;
  long *local_60;
  undefined1 local_58 [8];
  undefined8 local_50;
  char local_48 [8];
  EventLoop *local_40;
  Event *pEStack_38;
  char local_30 [16];
  uint uStack_20;
  undefined4 uStack_1c;
  
  if (((this->isResolved == false) && (methodId == 0 && interfaceId == 0xc8cb212fcd9f5691)) &&
     ((((this->super_RpcClient).connectionState.ptr)->gateway).ptr.isSet == true)) {
    kj::_::ForkHub<kj::Own<capnp::ClientHook>_>::addBranch
              ((ForkHub<kj::Own<capnp::ClientHook>_> *)local_58);
    newLocalPromiseClient((capnp *)&local_68,(Promise<kj::Own<capnp::ClientHook>_> *)local_58);
    local_30[0] = (sizeHint->ptr).isSet;
    if ((bool)local_30[0] == true) {
      local_30._8_4_ = *(undefined4 *)&(sizeHint->ptr).field_1;
      local_30._12_4_ = *(undefined4 *)((long)&(sizeHint->ptr).field_1 + 4);
      uStack_20 = (sizeHint->ptr).field_1.value.capCount;
      uStack_1c = *(undefined4 *)((long)&(sizeHint->ptr).field_1 + 0xc);
    }
    (**(code **)*local_60)(__return_storage_ptr__,local_60,0xc8cb212fcd9f5691,0,local_30);
    plVar2 = local_60;
    if (local_60 != (long *)0x0) {
      local_60 = (long *)0x0;
      (**(code **)*local_68)(local_68,(long)plVar2 + *(long *)(*plVar2 + -0x10));
    }
    plVar2 = local_50;
    if (local_50 != (long *)0x0) {
      local_50._0_4_ = 0;
      local_50._4_4_ = 0;
      (**(code **)*(_func_int **)local_58)(local_58,(long)plVar2 + *(long *)(*plVar2 + -0x10));
    }
  }
  else {
    this->receivedCall = true;
    pCVar1 = (this->cap).ptr;
    local_48[0] = (sizeHint->ptr).isSet;
    if ((bool)local_48[0] == true) {
      local_40 = (EventLoop *)(sizeHint->ptr).field_1.value.wordCount;
      pEStack_38 = *(Event **)((long)&(sizeHint->ptr).field_1 + 8);
    }
    (**pCVar1->_vptr_ClientHook)(__return_storage_ptr__,pCVar1,interfaceId,(ulong)methodId,local_48)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

Request<AnyPointer, AnyPointer> newCall(
        uint64_t interfaceId, uint16_t methodId, kj::Maybe<MessageSize> sizeHint) override {
      if (!isResolved && interfaceId == typeId<Persistent<>>() && methodId == 0 &&
          connectionState->gateway != nullptr) {
        // This is a call to Persistent.save(), and we're not resolved yet, and the underlying
        // remote capability will perform a gateway translation. This isn't right if the promise
        // ultimately resolves to a local capability. Instead, we'll need to queue the call until
        // the promise resolves.
        return newLocalPromiseClient(fork.addBranch())
            ->newCall(interfaceId, methodId, sizeHint);
      }

      receivedCall = true;
      return cap->newCall(interfaceId, methodId, sizeHint);
    }